

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *this,size_type index)

{
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pvVar1;
  format_arg *pfVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  uVar4 = this->types_;
  if ((long)uVar4 < 0) {
    uVar3 = (ulong)index;
    if (-uVar4 <= uVar3) {
      return __return_storage_ptr__;
    }
    pfVar2 = (this->field_1).args_;
    __return_storage_ptr__->type_ = pfVar2[uVar3].type_;
    pfVar2 = pfVar2 + uVar3;
    iVar5 = (pfVar2->value_).field_0.int_value;
    uVar6 = *(undefined4 *)((long)&(pfVar2->value_).field_0 + 4);
    uVar7 = *(undefined4 *)((long)&(pfVar2->value_).field_0 + 8);
    uVar8 = *(undefined4 *)((long)&(pfVar2->value_).field_0 + 0xc);
  }
  else {
    if (0xf < index) {
      return __return_storage_ptr__;
    }
    uVar4 = uVar4 >> ((char)index * '\x04' & 0x3fU);
    __return_storage_ptr__->type_ = (type)uVar4 & (pointer_type|uint_type);
    if ((uVar4 & 0xf) == 0) {
      return __return_storage_ptr__;
    }
    pvVar1 = (this->field_1).values_ + index;
    iVar5 = (pvVar1->field_0).int_value;
    uVar6 = *(undefined4 *)((long)&pvVar1->field_0 + 4);
    uVar7 = *(undefined4 *)((long)&pvVar1->field_0 + 8);
    uVar8 = *(undefined4 *)((long)&pvVar1->field_0 + 0xc);
  }
  (__return_storage_ptr__->value_).field_0.int_value = iVar5;
  *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 4) = uVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 8) = uVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 0xc) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(size_type index) const {
    format_arg arg;
    long long signed_types = static_cast<long long>(types_);
    if (signed_types < 0) {
      unsigned long long num_args =
          static_cast<unsigned long long>(-signed_types);
      if (index < num_args)
        arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }